

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iec61131.l.cpp
# Opt level: O3

void __thiscall deci_FlexLexer::yyrestart(deci_FlexLexer *this,istream *input_file)

{
  int iVar1;
  undefined4 extraout_var;
  yy_buffer_state **ppyVar2;
  size_t sVar3;
  YY_BUFFER_STATE b;
  
  ppyVar2 = this->yy_buffer_stack;
  if ((ppyVar2 == (yy_buffer_state **)0x0) ||
     (sVar3 = this->yy_buffer_stack_top, ppyVar2[sVar3] == (yy_buffer_state *)0x0)) {
    yyensure_buffer_stack(this);
    iVar1 = (*(this->super_FlexLexer)._vptr_FlexLexer[4])(this,&this->yyin,0x4000);
    sVar3 = this->yy_buffer_stack_top;
    this->yy_buffer_stack[sVar3] = (yy_buffer_state *)CONCAT44(extraout_var,iVar1);
    ppyVar2 = this->yy_buffer_stack;
    if (ppyVar2 == (yy_buffer_state **)0x0) {
      b = (YY_BUFFER_STATE)0x0;
      goto LAB_00112982;
    }
  }
  b = ppyVar2[sVar3];
LAB_00112982:
  yy_init_buffer(this,b,input_file);
  yy_load_buffer_state(this);
  return;
}

Assistant:

void yyFlexLexer::yyrestart( std::istream& input_file )
{
    
	if ( ! YY_CURRENT_BUFFER ){
        yyensure_buffer_stack ();
		YY_CURRENT_BUFFER_LVALUE =
            yy_create_buffer( yyin, YY_BUF_SIZE );
	}

	yy_init_buffer( YY_CURRENT_BUFFER, input_file );
	yy_load_buffer_state(  );
}